

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.hpp
# Opt level: O2

void __thiscall diy::FileStorage::get(FileStorage *this,int i,MemoryBuffer *bb,size_t extra)

{
  int __fd;
  vector<char,_std::allocator<char>_> *this_00;
  FileRecord fr;
  undefined1 local_58 [8];
  _Alloc_hider local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  extract_file_record((FileRecord *)local_58,this,i);
  std::make_shared<diy::spd::logger>();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  this_00 = &bb->buffer;
  std::vector<char,_std::allocator<char>_>::reserve(this_00,extra + (long)local_58);
  std::vector<char,_std::allocator<char>_>::resize(this_00,(size_type)local_58);
  __fd = open(local_50._M_p,0x101000,0x180);
  read(__fd,(this_00->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
            super__Vector_impl_data._M_start,(size_t)local_58);
  io::utils::close(__fd);
  remove_file(this,(FileRecord *)local_58);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

virtual void   get(int i, MemoryBuffer& bb, size_t extra) override
      {
        FileRecord fr = extract_file_record(i);

        get_logger()->debug("FileStorage::get(): {}", fr.name);

        bb.buffer.reserve(fr.size + extra);
        bb.buffer.resize(fr.size);
#if defined(_WIN32)
        int fh = -1;
        _sopen_s(&fh, fr.name.c_str(), _O_RDONLY | _O_BINARY, _SH_DENYNO, _S_IREAD);
        _read(fh, &bb.buffer[0], static_cast<unsigned int>(fr.size));
#else
        int fh = open(fr.name.c_str(), O_RDONLY | O_SYNC, 0600);
        auto n = read(fh, &bb.buffer[0], fr.size);
        DIY_UNUSED(n);
#endif
        io::utils::close(fh);
        remove_file(fr);
      }